

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pUVar4;
  pointer pUVar5;
  long lVar6;
  ulong uVar7;
  
  if (0 < num) {
    uVar7 = (ulong)(uint)num;
    lVar6 = (long)start << 4;
    do {
      UnknownField::Delete
                ((UnknownField *)
                 ((long)&((this->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_start)->number_ + lVar6));
      lVar6 = lVar6 + 0x10;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = (ulong)(start + num);
  pUVar4 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar5 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (uVar7 < (ulong)((long)pUVar5 - (long)pUVar4 >> 4)) {
    lVar6 = uVar7 << 4;
    do {
      puVar1 = (undefined8 *)((long)&pUVar4->number_ + lVar6);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pUVar4[-(long)num].number_ + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      uVar7 = uVar7 + 1;
      pUVar4 = (this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar5 = (this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)pUVar5 - (long)pUVar4 >> 4));
  }
  if (0 < num) {
    (this->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar5 + (-1 - (ulong)(num - 1));
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_.size(); ++i) {
    (fields_)[i - num] = (fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_.pop_back();
  }
}